

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall
Connection::Connection(Connection *this,string *name_from,string *name_to,string *label)

{
  string *this_00;
  size_type sVar1;
  size_type sVar2;
  
  std::__cxx11::string::string((string *)this,(string *)name_from);
  this_00 = &this->name_to;
  std::__cxx11::string::string((string *)this_00,(string *)name_to);
  std::__cxx11::string::string((string *)&this->label,(string *)label);
  std::__cxx11::string::assign((char *)this);
  sVar1 = name_from->_M_string_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)this);
  }
  std::__cxx11::string::assign((char *)this_00);
  sVar1 = name_to->_M_string_length;
  for (sVar2 = 0; sVar1 != sVar2; sVar2 = sVar2 + 1) {
    std::__cxx11::string::push_back((char)this_00);
  }
  return;
}

Assistant:

Connection::Connection(const string &name_from, const string &name_to, const string &label) : name_from(name_from),
                                                                                              name_to(name_to),
                                                                                              label(label) {
    this->name_from = "";
    for (char c: name_from) {
        if (c == '#')
            c = '_';
        this->name_from += c;
    }

    this->name_to = "";
    for (char c: name_to) {
        if (c == '#')
            c = '_';
        this->name_to += c;
    }
}